

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

void __thiscall L11_2::Vector::reset(Vector *this,double arg1,double arg2,MODE mode)

{
  double dVar1;
  double dVar2;
  long lStack_20;
  
  if (mode == RECT) {
    this->_x = arg1;
    this->_y = arg2;
    this->_radius = SQRT(arg1 * arg1 + arg2 * arg2);
    dVar2 = atan2(arg2,arg1);
    lStack_20 = 0x10;
  }
  else {
    this->_radius = arg1;
    this->_radian = arg2;
    dVar2 = cos(arg2);
    this->_x = dVar2 * arg1;
    dVar1 = this->_radius;
    dVar2 = sin(this->_radian);
    dVar2 = dVar2 * dVar1;
    lStack_20 = 8;
  }
  *(double *)((long)&this->_x + lStack_20) = dVar2;
  return;
}

Assistant:

void Vector::reset(double arg1, double arg2, MODE mode) {
        if (mode == MODE::RECT) {
            _x = arg1;
            _y = arg2;
            _radius = std::sqrt(_x * _x + _y * _y);
            _radian = std::atan2(_y, _x);
        } else {
            _radius = arg1;
            _radian = arg2;
            _x = _radius * std::cos(_radian);
            _y = _radius * std::sin(_radian);
        }
    }